

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::
     Serialization<std::vector<diy::io::detail::GidOffsetCount,_std::allocator<diy::io::detail::GidOffsetCount>_>_>
     ::load(BinaryBuffer *bb,Vector *v)

{
  vector<diy::io::detail::GidOffsetCount,_std::allocator<diy::io::detail::GidOffsetCount>_> *in_RSI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffb8;
  BinaryBuffer *in_stack_ffffffffffffffc0;
  BinaryBuffer *in_stack_ffffffffffffffd0;
  value_type *in_stack_ffffffffffffffe0;
  GidOffsetCount *in_stack_ffffffffffffffe8;
  GidOffsetCount *__new_size;
  vector<diy::io::detail::GidOffsetCount,_std::allocator<diy::io::detail::GidOffsetCount>_> *this;
  
  load<unsigned_long>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  __new_size = in_stack_ffffffffffffffe8;
  this = in_RSI;
  io::detail::GidOffsetCount::GidOffsetCount((GidOffsetCount *)&stack0xffffffffffffffd0);
  std::vector<diy::io::detail::GidOffsetCount,_std::allocator<diy::io::detail::GidOffsetCount>_>::
  resize(this,(size_type)__new_size,in_stack_ffffffffffffffe0);
  if (__new_size != (GidOffsetCount *)0x0) {
    std::vector<diy::io::detail::GidOffsetCount,_std::allocator<diy::io::detail::GidOffsetCount>_>::
    operator[](this,0);
    load<diy::io::detail::GidOffsetCount>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffe8,(size_t)in_RSI);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }